

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildWithDepsLogTest::SetUp(BuildWithDepsLogTest *this)

{
  allocator<char> local_31;
  string local_30;
  BuildWithDepsLogTest *local_10;
  BuildWithDepsLogTest *this_local;
  
  local_10 = this;
  BuildTest::SetUp(&this->super_BuildTest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"BuildWithDepsLogTest",&local_31);
  ScopedTempDir::CreateAndEnter(&this->temp_dir_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

virtual void SetUp() {
    BuildTest::SetUp();

    temp_dir_.CreateAndEnter("BuildWithDepsLogTest");
  }